

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O2

BSDFSample * __thiscall
pbrt::NormalizedFresnelBxDF::Sample_f
          (BSDFSample *__return_storage_ptr__,NormalizedFresnelBxDF *this,Vector3f *wo,Float uc,
          Point2f *u,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar7 [32];
  undefined1 in_register_00001204 [60];
  undefined1 auVar10 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined4 in_XMM1_Db;
  undefined8 in_XMM1_Qb;
  Vector3f VVar11;
  SampledSpectrum SVar12;
  Tuple3<pbrt::Vector3,_float> local_38;
  ulong uVar6;
  
  auVar10 = in_register_00001204._4_56_;
  if ((sampleFlags & Reflection) == Unset) {
    auVar7 = ZEXT1232(ZEXT412(0));
    *(undefined1 (*) [32])((__return_storage_ptr__->f).values.values + 3) = auVar7;
    __return_storage_ptr__->f = (SampledSpectrum)auVar7._0_16_;
    __return_storage_ptr__->wi = (Vector3f)auVar7._16_12_;
    __return_storage_ptr__->pdf = (Float)auVar7._28_4_;
    __return_storage_ptr__->eta = 1.0;
  }
  else {
    VVar11 = SampleCosineHemisphere(u);
    local_38.z = VVar11.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar8._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar8._8_56_ = auVar10;
    local_38._0_8_ = vmovlps_avx(auVar8._0_16_);
    uVar6 = 0;
    if ((wo->super_Tuple3<pbrt::Vector3,_float>).z < 0.0) {
      auVar4._8_4_ = 0x80000000;
      auVar4._0_8_ = 0x8000000080000000;
      auVar4._12_4_ = 0x80000000;
      auVar5._4_4_ = in_XMM1_Db;
      auVar5._0_4_ = local_38.z;
      auVar5._8_8_ = in_XMM1_Qb;
      auVar4 = vxorps_avx512vl(auVar5,auVar4);
      uVar6 = auVar4._8_8_;
      local_38.z = auVar4._0_4_;
    }
    auVar10 = ZEXT856(uVar6);
    SVar12 = f(this,wo,(Vector3f *)&local_38,mode);
    auVar9._0_8_ = SVar12.values.values._0_8_;
    auVar9._8_56_ = auVar10;
    auVar2._8_4_ = 0x7fffffff;
    auVar2._0_8_ = 0x7fffffff7fffffff;
    auVar2._12_4_ = 0x7fffffff;
    auVar5 = vandps_avx512vl(ZEXT416((uint)local_38.z),auVar2);
    uVar1 = vcmpss_avx512f(ZEXT416((uint)(local_38.z * (wo->super_Tuple3<pbrt::Vector3,_float>).z)),
                           ZEXT416(0),0xe);
    auVar3._8_8_ = in_XMM1_Qb;
    auVar3._0_8_ = SVar12.values.values._8_8_;
    auVar4 = vmovlhps_avx(auVar9._0_16_,auVar3);
    *(undefined1 (*) [16])(__return_storage_ptr__->f).values.values = auVar4;
    (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = local_38.x;
    (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y = local_38.y;
    (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = local_38.z;
    __return_storage_ptr__->pdf =
         (Float)((uint)((byte)uVar1 & 1) * (int)(auVar5._0_4_ * 0.31830987));
    __return_storage_ptr__->flags = DiffuseReflection;
    __return_storage_ptr__->eta = 1.0;
    __return_storage_ptr__->pdfIsProportional = false;
  }
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    BSDFSample Sample_f(const Vector3f &wo, Float uc, const Point2f &u,
                        TransportMode mode, BxDFReflTransFlags sampleFlags) const {
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            return {};

        // Cosine-sample the hemisphere, flipping the direction if necessary
        Vector3f wi = SampleCosineHemisphere(u);
        if (wo.z < 0)
            wi.z *= -1;
        return BSDFSample(f(wo, wi, mode), wi, PDF(wo, wi, mode, sampleFlags),
                          BxDFFlags::DiffuseReflection);
    }